

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrowRef(TranslateToFuzzReader *this,Type type)

{
  Expression *exnref;
  ThrowRef *pTVar1;
  Type local_20;
  
  if (type.id == 1) {
    Type::Type(&local_20,(HeapType)0x48,Nullable,Inexact);
    exnref = make(this,local_20);
    pTVar1 = Builder::makeThrowRef(&this->builder,exnref);
    return (Expression *)pTVar1;
  }
  __assert_fail("type == Type::unreachable",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1458,"Expression *wasm::TranslateToFuzzReader::makeThrowRef(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeThrowRef(Type type) {
  assert(type == Type::unreachable);
  // Use a nullable type here to avoid the risk of trapping (when we find no way
  // to make a non-nullable ref, we end up fixing validation with
  // ref.as_non_null of a null, which validates but traps).
  auto* ref = make(Type(HeapType::exn, Nullable));
  return builder.makeThrowRef(ref);
}